

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O3

int idamax(int n,double *dx,int incx)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  iVar2 = 0;
  if ((0 < incx && 0 < n) && (iVar2 = 1, n != 1)) {
    dVar8 = ABS(*dx);
    if (incx == 1) {
      uVar3 = 1;
      uVar4 = 1;
      do {
        dVar9 = ABS(dx[uVar4]);
        uVar4 = uVar4 + 1;
        if (dVar8 < dVar9) {
          uVar3 = uVar4 & 0xffffffff;
        }
        iVar2 = (int)uVar3;
        if (dVar9 <= dVar8) {
          dVar9 = dVar8;
        }
        dVar8 = dVar9;
      } while ((uint)n != uVar4);
    }
    else {
      pdVar5 = dx + (uint)incx;
      iVar2 = 1;
      iVar6 = 2;
      do {
        dVar9 = ABS(*pdVar5);
        iVar1 = iVar6;
        if (ABS(*pdVar5) <= dVar8) {
          dVar9 = dVar8;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        dVar8 = dVar9;
        pdVar5 = pdVar5 + (uint)incx;
        bVar7 = iVar6 != n;
        iVar6 = iVar6 + 1;
      } while (bVar7);
    }
  }
  return iVar2;
}

Assistant:

int idamax ( int n, double dx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    IDAMAX finds the index of the vector element of maximum absolute value.
//
//  Discussion:
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double X[*], the vector to be examined.
//
//    Input, int INCX, the increment between successive entries of SX.
//
//    Output, int IDAMAX, the index of the element of maximum
//    absolute value.
//
{
  double dmax;
  int i;
  int ix;
  int value;

  value = 0;

  if ( n < 1 || incx <= 0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    dmax = fabs ( dx[0] );

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[i] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[i] );
      }
    }
  }
  else
  {
    ix = 0;
    dmax = fabs ( dx[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[ix] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[ix] );
      }
      ix = ix + incx;
    }
  }

  return value;
}